

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool re2::RE2::Replace(string *str,RE2 *re,StringPiece *rewrite)

{
  int endpos;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  string s;
  StringPiece vec [17];
  
  lVar5 = 8;
  do {
    *(undefined8 *)((long)vec + lVar5 + -8) = 0;
    *(undefined4 *)((long)&vec[0].ptr_ + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x118);
  uVar4 = MaxSubmatch(rewrite);
  if (uVar4 < 0x11) {
    s._M_dataplus._M_p = (str->_M_dataplus)._M_p;
    endpos = (int)str->_M_string_length;
    s._M_string_length = CONCAT44(s._M_string_length._4_4_,endpos);
    bVar3 = false;
    bVar2 = Match(re,(StringPiece *)&s,0,endpos,UNANCHORED,vec,uVar4 + 1);
    if (bVar2) {
      s._M_dataplus._M_p = (pointer)&s.field_2;
      s._M_string_length = 0;
      s.field_2._M_local_buf[0] = '\0';
      bVar3 = Rewrite(re,&s,rewrite,vec,uVar4 + 1);
      if (bVar3) {
        pcVar1 = (str->_M_dataplus)._M_p;
        if (vec[0].ptr_ < pcVar1) {
          __assert_fail("vec[0].begin() >= str->data()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                        ,0x177,
                        "static bool re2::RE2::Replace(string *, const RE2 &, const StringPiece &)")
          ;
        }
        if (pcVar1 + str->_M_string_length < vec[0].ptr_ + vec[0].length_) {
          __assert_fail("vec[0].end() <= str->data()+str->size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                        ,0x178,
                        "static bool re2::RE2::Replace(string *, const RE2 &, const StringPiece &)")
          ;
        }
        std::__cxx11::string::replace
                  ((ulong)str,(long)vec[0].ptr_ - (long)pcVar1,(string *)(long)vec[0].length_);
      }
      std::__cxx11::string::~string((string *)&s);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool RE2::Replace(string *str,
                 const RE2& re,
                 const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;
  if (!re.Match(*str, 0, static_cast<int>(str->size()), UNANCHORED, vec, nvec))
    return false;

  string s;
  if (!re.Rewrite(&s, rewrite, vec, nvec))
    return false;

  assert(vec[0].begin() >= str->data());
  assert(vec[0].end() <= str->data()+str->size());
  str->replace(vec[0].data() - str->data(), vec[0].size(), s);
  return true;
}